

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O3

void af_glyph_hints_align_edge_points(AF_GlyphHints hints,AF_Dimension dim)

{
  uint uVar1;
  AF_Segment_conflict pAVar2;
  AF_Segment pAVar3;
  AF_Segment_conflict pAVar4;
  AF_Segment_conflict pAVar5;
  AF_Segment_conflict pAVar6;
  
  pAVar4 = hints->axis[dim].segments;
  if (pAVar4 != (AF_Segment_conflict)0x0) {
    uVar1 = hints->axis[dim].num_segments;
    pAVar5 = pAVar4 + uVar1;
    if (dim == AF_DIMENSION_HORZ) {
      if (uVar1 != 0) {
        do {
          if (pAVar4->edge != (AF_Edge_conflict)0x0) {
            pAVar2 = (AF_Segment_conflict)pAVar4->last;
            pAVar3 = (AF_Segment)pAVar4->edge->pos;
            pAVar6 = pAVar4;
            do {
              pAVar6 = (AF_Segment_conflict)pAVar6->first;
              pAVar6->link = pAVar3;
              pAVar6->flags = (byte)*(FT_UShort *)&pAVar6->flags | 4;
            } while (pAVar6 != pAVar2);
          }
          pAVar4 = pAVar4 + 1;
        } while (pAVar4 < pAVar5);
      }
    }
    else if (uVar1 != 0) {
      do {
        if (pAVar4->edge != (AF_Edge_conflict)0x0) {
          pAVar2 = (AF_Segment_conflict)pAVar4->last;
          pAVar3 = (AF_Segment)pAVar4->edge->pos;
          pAVar6 = pAVar4;
          do {
            pAVar6 = (AF_Segment_conflict)pAVar6->first;
            pAVar6->serif = pAVar3;
            pAVar6->flags = (byte)*(FT_UShort *)&pAVar6->flags | 8;
          } while (pAVar6 != pAVar2);
        }
        pAVar4 = pAVar4 + 1;
      } while (pAVar4 < pAVar5);
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_align_edge_points( AF_GlyphHints  hints,
                                    AF_Dimension   dim )
  {
    AF_AxisHints  axis          = & hints->axis[dim];
    AF_Segment    segments      = axis->segments;
    AF_Segment    segment_limit = FT_OFFSET( segments, axis->num_segments );
    AF_Segment    seg;


    if ( dim == AF_DIMENSION_HORZ )
    {
      for ( seg = segments; seg < segment_limit; seg++ )
      {
        AF_Edge   edge = seg->edge;
        AF_Point  point, first, last;


        if ( !edge )
          continue;

        first = seg->first;
        last  = seg->last;
        point = first;
        for (;;)
        {
          point->x      = edge->pos;
          point->flags |= AF_FLAG_TOUCH_X;

          if ( point == last )
            break;

          point = point->next;
        }
      }
    }
    else
    {
      for ( seg = segments; seg < segment_limit; seg++ )
      {
        AF_Edge   edge = seg->edge;
        AF_Point  point, first, last;


        if ( !edge )
          continue;

        first = seg->first;
        last  = seg->last;
        point = first;
        for (;;)
        {
          point->y      = edge->pos;
          point->flags |= AF_FLAG_TOUCH_Y;

          if ( point == last )
            break;

          point = point->next;
        }
      }
    }
  }